

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O2

pair<std::shared_ptr<Schedule>,_int> *
Schedule::fromFile(pair<std::shared_ptr<Schedule>,_int> *__return_storage_ptr__,string *path)

{
  bool bVar1;
  reference this;
  reference json_00;
  undefined8 extraout_RAX;
  int id;
  Task *pTVar2;
  __shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<Schedule> schedule;
  TaskHandle tail;
  json json;
  iterator __begin1;
  TaskHandle task;
  iterator __end1;
  ifstream file;
  
  std::ifstream::ifstream((istream *)&file,(string *)path,_S_in);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&json,(nullptr_t)0x0);
  nlohmann::operator>>((istream *)&file,&json);
  std::make_shared<Schedule>();
  Common::fromJson((Common *)&__begin1,&json);
  std::__shared_ptr<Common,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Common,_(__gnu_cxx::_Lock_policy)2> *)
             schedule.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (__shared_ptr<Common,_(__gnu_cxx::_Lock_policy)2> *)&__begin1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__begin1.m_it);
  tail.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  tail.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this = nlohmann::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
         ::operator[]<char_const>
                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     *)&json,"code");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::begin(&__begin1,this);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::end(&__end1,this);
  id = 0;
  while( true ) {
    bVar1 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::operator!=(&__begin1,&__end1);
    if (!bVar1) break;
    json_00 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*(&__begin1);
    id = id + 1;
    Task::fromJson((Task *)&task,id,
                   &(((schedule.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     common).super___shared_ptr<Common,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    operands,json_00);
    if (tail.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
      this_00 = &((schedule.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->head).
                 super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>;
      pTVar2 = (Task *)&task;
    }
    else {
      std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&((tail.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->next).
                  super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2> *)&task);
      this_00 = &((task.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->prev).
                 super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>;
      pTVar2 = (Task *)&tail;
    }
    std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_00,(__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2> *)pTVar2);
    std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2> *)&tail,
               (__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2> *)&task);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&task.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++(&__begin1);
  }
  __begin1.m_object = (pointer)0x0;
  __begin1.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&((tail.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->next).
              super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2> *)&__begin1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__begin1.m_it);
  Common::recordAttributes
            (((schedule.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->common).
             super___shared_ptr<Common,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &(schedule.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->head);
  Common::analyzePlacement
            (((schedule.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->common).
             super___shared_ptr<Common,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &(schedule.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->head);
  bVar1 = Common::check(((schedule.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->common).super___shared_ptr<Common,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        &(schedule.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->head);
  if (bVar1) {
    Common::analyzeShare
              (((schedule.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->common).
               super___shared_ptr<Common,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &(schedule.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->head);
    Common::refactor(&(schedule.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      head);
    std::__shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__,
               &schedule.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>);
    __return_storage_ptr__->second = id;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&tail.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&schedule.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&json);
    std::ifstream::~ifstream(&file);
    return __return_storage_ptr__;
  }
  error("Origin schedule in file %s check failed.",(path->_M_dataplus)._M_p);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tail.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&schedule.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&json);
  std::ifstream::~ifstream(&file);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

static std::pair<ScheduleHandle, int> fromFile(const std::string &path) {
        // Read JSON
        std::ifstream file(path);
        nlohmann::json json;
        file >> json;

        // Operands
        auto schedule = std::make_shared<Schedule>();
        schedule->common = Common::fromJson(json);

        // Records
        int count = 0;
        TaskHandle tail;
        for (auto &item: json["code"]) {
            auto task = Task::fromJson(++ count, schedule->common->operands, item);
            if (not tail) {
                schedule->head = task;
                tail = task;
            } else {
                tail->next = task;
                task->prev = tail;
                tail = task;
            }
        }
        tail->next = nullptr;

        // Analyze common elements and refactor to the format without .dealloc and .share
        schedule->common->recordAttributes(schedule->head);
        schedule->common->analyzePlacement(schedule->head);
        if (not schedule->common->check(schedule->head)) {
            error("Origin schedule in file %s check failed.", path.c_str());
        }
        schedule->common->analyzeShare(schedule->head);
        schedule->common->refactor(schedule->head);

        return std::make_pair(schedule, count);
    }